

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::create_dir(filename_t *path)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *in_RDI;
  filename_t *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  size_type token_pos;
  size_t search_offset;
  string local_40 [32];
  long local_20;
  ulong local_18;
  byte local_1;
  
  bVar1 = path_exists(in_stack_00000020);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_18 = 0;
      do {
        local_20 = std::__cxx11::string::find_first_of(in_RDI,0x1c3b7c);
        if (local_20 == -1) {
          local_20 = std::__cxx11::string::size();
        }
        std::__cxx11::string::substr((ulong)local_40,(ulong)in_RDI);
        uVar2 = std::__cxx11::string::empty();
        if ((((uVar2 & 1) != 0) || (bVar1 = path_exists(in_stack_00000020), bVar1)) ||
           (bVar1 = mkdir_((filename_t *)0x15c3c6), bVar1)) {
          local_18 = local_20 + 1;
          bVar1 = false;
        }
        else {
          local_1 = 0;
          bVar1 = true;
        }
        std::__cxx11::string::~string(local_40);
        uVar2 = local_18;
        if (bVar1) goto LAB_0015c455;
        uVar3 = std::__cxx11::string::size();
      } while (uVar2 < uVar3);
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
LAB_0015c455:
  return (bool)(local_1 & 1);
}

Assistant:

SPDLOG_INLINE bool create_dir(filename_t path)
{
    if (path_exists(path))
    {
        return true;
    }

    if (path.empty())
    {
        return false;
    }

    size_t search_offset = 0;
    do
    {
        auto token_pos = path.find_first_of(folder_seps_filename, search_offset);
        // treat the entire path as a folder if no folder separator not found
        if (token_pos == filename_t::npos)
        {
            token_pos = path.size();
        }

        auto subdir = path.substr(0, token_pos);

        if (!subdir.empty() && !path_exists(subdir) && !mkdir_(subdir))
        {
            return false; // return error if failed creating dir
        }
        search_offset = token_pos + 1;
    } while (search_offset < path.size());

    return true;
}